

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_py_generator.cc
# Opt level: O2

void __thiscall t_py_generator::init_generator(t_py_generator *this)

{
  string *__lhs;
  ofstream_with_content_based_conditional_update *this_00;
  bool gen_twisted;
  t_program *program;
  int iVar1;
  int *piVar2;
  long lVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  char *__rhs;
  int __oflag;
  int __oflag_00;
  int __oflag_01;
  pointer pptVar5;
  string local_350;
  string f_types_name;
  string local_310;
  ofstream_with_content_based_conditional_update *local_2f0;
  string module;
  vector<t_service_*,_std::allocator<t_service_*>_> services;
  string f_consts_name;
  string f_init_name;
  string local_270;
  string local_250;
  ofstream_with_content_based_conditional_update f_init;
  
  program = (this->super_t_generator).program_;
  gen_twisted = this->gen_twisted_;
  std::__cxx11::string::string((string *)&local_250,"",(allocator *)&f_init);
  get_real_py_module(&module,program,gen_twisted,&local_250);
  std::__cxx11::string::~string((string *)&local_250);
  (*(this->super_t_generator)._vptr_t_generator[0x1b])(&f_init,this);
  __lhs = &this->package_dir_;
  std::__cxx11::string::operator=((string *)__lhs,(string *)&f_init);
  std::__cxx11::string::~string((string *)&f_init);
  std::__cxx11::string::_M_assign((string *)&this->module_);
  while( true ) {
    iVar1 = mkdir((__lhs->_M_dataplus)._M_p,0x1ff);
    if (iVar1 == -1) {
      piVar2 = __errno_location();
      if (*piVar2 != 0x11) {
        __return_storage_ptr__ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __cxa_allocate_exception(0x20);
        std::__cxx11::string::string
                  ((string *)&f_types_name,(__lhs->_M_dataplus)._M_p,(allocator *)&f_consts_name);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f_init,
                       &f_types_name,": ");
        __rhs = strerror(*piVar2);
        std::operator+(__return_storage_ptr__,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f_init,
                       __rhs);
        __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                    std::__cxx11::string::~string);
      }
    }
    std::operator+(&f_types_name,__lhs,"/__init__.py");
    std::ofstream::ofstream(&f_init,f_types_name._M_dataplus._M_p,_S_app);
    std::__cxx11::string::~string((string *)&f_types_name);
    std::ofstream::close();
    if (module._M_string_length == 0) break;
    lVar3 = std::__cxx11::string::find((char)&module,0x2e);
    if (lVar3 == -1) {
      std::__cxx11::string::append((char *)__lhs);
      std::__cxx11::string::append((string *)__lhs);
      module._M_string_length = 0;
      *module._M_dataplus._M_p = '\0';
    }
    else {
      std::__cxx11::string::append((char *)__lhs);
      std::__cxx11::string::substr((ulong)&f_types_name,(ulong)&module);
      std::__cxx11::string::append((string *)__lhs);
      std::__cxx11::string::~string((string *)&f_types_name);
      std::__cxx11::string::erase((ulong)&module,0);
    }
    std::ofstream::~ofstream(&f_init);
  }
  std::ofstream::~ofstream(&f_init);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f_init,__lhs,
                 "/");
  std::operator+(&f_types_name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f_init,
                 "ttypes.py");
  std::__cxx11::string::~string((string *)&f_init);
  std::__cxx11::string::string
            ((string *)&f_init,f_types_name._M_dataplus._M_p,(allocator *)&f_consts_name);
  this_00 = &this->f_types_;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            (this_00,(char *)&f_init,__oflag);
  std::__cxx11::string::~string((string *)&f_init);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f_init,__lhs,
                 "/");
  std::operator+(&f_consts_name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f_init,
                 "constants.py");
  std::__cxx11::string::~string((string *)&f_init);
  std::__cxx11::string::string
            ((string *)&f_init,f_consts_name._M_dataplus._M_p,(allocator *)&f_init_name);
  local_2f0 = &this->f_consts_;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            (local_2f0,(char *)&f_init,__oflag_00);
  std::__cxx11::string::~string((string *)&f_init);
  std::operator+(&f_init_name,__lhs,"/__init__.py");
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update(&f_init);
  std::__cxx11::string::string
            ((string *)&local_350,f_init_name._M_dataplus._M_p,(allocator *)&local_310);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            (&f_init,(char *)&local_350,__oflag_01);
  std::__cxx11::string::~string((string *)&local_350);
  std::operator<<((ostream *)&f_init,"__all__ = [\'ttypes\', \'constants\'");
  std::vector<t_service_*,_std::allocator<t_service_*>_>::vector
            (&services,&((this->super_t_generator).program_)->services_);
  for (pptVar5 = services.super__Vector_base<t_service_*,_std::allocator<t_service_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pptVar5 !=
      services.super__Vector_base<t_service_*,_std::allocator<t_service_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar5 = pptVar5 + 1) {
    poVar4 = std::operator<<((ostream *)&f_init,", \'");
    iVar1 = (*((*pptVar5)->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var,iVar1));
    std::operator<<(poVar4,"\'");
  }
  poVar4 = std::operator<<((ostream *)&f_init,"]");
  iVar1 = 0x36c748;
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            (&f_init,iVar1);
  py_autogen_comment_abi_cxx11_(&local_350,this);
  poVar4 = std::operator<<((ostream *)this_00,(string *)&local_350);
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  py_imports_abi_cxx11_(&local_310,this);
  poVar4 = std::operator<<(poVar4,(string *)&local_310);
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  render_includes_abi_cxx11_(&local_270,this);
  poVar4 = std::operator<<(poVar4,(string *)&local_270);
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,"from thrift.transport import TTransport");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&this->import_dynbase_);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_350);
  poVar4 = std::operator<<((ostream *)this_00,"all_structs = []");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  py_autogen_comment_abi_cxx11_(&local_350,this);
  poVar4 = std::operator<<((ostream *)local_2f0,(string *)&local_350);
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  py_imports_abi_cxx11_(&local_310,this);
  poVar4 = std::operator<<(poVar4,(string *)&local_310);
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,"from .ttypes import *");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_350);
  std::_Vector_base<t_service_*,_std::allocator<t_service_*>_>::~_Vector_base
            (&services.super__Vector_base<t_service_*,_std::allocator<t_service_*>_>);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  ~template_ofstream_with_content_based_conditional_update(&f_init);
  std::__cxx11::string::~string((string *)&f_init_name);
  std::__cxx11::string::~string((string *)&f_consts_name);
  std::__cxx11::string::~string((string *)&f_types_name);
  std::__cxx11::string::~string((string *)&module);
  return;
}

Assistant:

void t_py_generator::init_generator() {
  // Make output directory
  string module = get_real_py_module(program_, gen_twisted_);
  package_dir_ = get_out_dir();
  module_ = module;
  while (true) {
    // TODO: Do better error checking here.
    MKDIR(package_dir_.c_str());
    std::ofstream init_py((package_dir_ + "/__init__.py").c_str(), std::ios_base::app);
    init_py.close();
    if (module.empty()) {
      break;
    }
    string::size_type pos = module.find('.');
    if (pos == string::npos) {
      package_dir_ += "/";
      package_dir_ += module;
      module.clear();
    } else {
      package_dir_ += "/";
      package_dir_ += module.substr(0, pos);
      module.erase(0, pos + 1);
    }
  }

  // Make output file
  string f_types_name = package_dir_ + "/" + "ttypes.py";
  f_types_.open(f_types_name.c_str());

  string f_consts_name = package_dir_ + "/" + "constants.py";
  f_consts_.open(f_consts_name.c_str());

  string f_init_name = package_dir_ + "/__init__.py";
  ofstream_with_content_based_conditional_update f_init;
  f_init.open(f_init_name.c_str());
  f_init << "__all__ = ['ttypes', 'constants'";
  vector<t_service*> services = program_->get_services();
  vector<t_service*>::iterator sv_iter;
  for (sv_iter = services.begin(); sv_iter != services.end(); ++sv_iter) {
    f_init << ", '" << (*sv_iter)->get_name() << "'";
  }
  f_init << "]" << endl;
  f_init.close();

  // Print header
  f_types_ << py_autogen_comment() << endl
           << py_imports() << endl
           << render_includes() << endl
           << "from thrift.transport import TTransport" << endl
           << import_dynbase_;

  f_types_ << "all_structs = []" << endl;

  f_consts_ <<
    py_autogen_comment() << endl <<
    py_imports() << endl <<
    "from .ttypes import *" << endl;
}